

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd.c
# Opt level: O3

nsh_status_t nsh_cmd_init(nsh_cmd_t *cmd,char *name,nsh_cmd_handler_t *handler)

{
  nsh_status_t nVar1;
  size_t sVar2;
  
  sVar2 = strlen(name);
  nVar1 = NSH_STATUS_WRONG_ARG;
  if (0xffffffffffffffef < sVar2 - 0x11) {
    strncpy(cmd->name,name,0x10);
    cmd->handler = handler;
    nVar1 = NSH_STATUS_OK;
  }
  return nVar1;
}

Assistant:

nsh_status_t nsh_cmd_init(nsh_cmd_t* cmd, const char* name, nsh_cmd_handler_t* handler)
{
    size_t name_len = strlen(name);
    if (name_len == 0 || name_len > NSH_MAX_STRING_SIZE) {
        return NSH_STATUS_WRONG_ARG;
    }

    strncpy(cmd->name, name, NSH_MAX_STRING_SIZE);
    cmd->handler = handler;
    return NSH_STATUS_OK;
}